

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

char * serilizeRr(DNSRr *dnsRr,int *length)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  in_addr_t iVar4;
  char *__s;
  size_t sVar5;
  char *__dest;
  char *pcVar6;
  int iVar7;
  long lStack_50;
  char *local_38;
  
  __s = toInternetFormat(dnsRr->name);
  if (dnsRr->type == 1) {
    iVar7 = 4;
  }
  else {
    local_38 = toInternetFormat(dnsRr->data);
    sVar5 = strlen(local_38);
    iVar7 = (int)sVar5;
  }
  sVar5 = strlen(__s);
  __dest = (char *)malloc((long)iVar7 + sVar5 + 0xe);
  checkMalloc(__dest);
  strcpy(__dest,__s);
  sVar5 = strlen(__s);
  pcVar6 = __dest + sVar5;
  free(__s);
  uVar1 = dnsRr->type;
  *(ushort *)(__dest + sVar5 + 1) = uVar1 << 8 | uVar1 >> 8;
  *(unsigned_short *)(__dest + sVar5 + 3) = dnsRr->class << 8 | dnsRr->class >> 8;
  uVar2 = dnsRr->ttl;
  *(uint *)(__dest + sVar5 + 5) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = (ushort)iVar7;
  if (uVar1 == 1) {
    *(ushort *)(pcVar6 + 9) = uVar3 << 8 | uVar3 >> 8;
    iVar4 = inet_addr(dnsRr->data);
    *(in_addr_t *)(pcVar6 + 0xb) = iVar4;
    lStack_50 = 0xb;
  }
  else {
    if (uVar1 == 0xf) {
      *(ushort *)(pcVar6 + 9) = (uVar3 + 3) * 0x100 | (ushort)(uVar3 + 3) >> 8;
      pcVar6[0xb] = '\0';
      pcVar6[0xc] = '\x05';
      lStack_50 = 0xd;
    }
    else {
      *(ushort *)(pcVar6 + 9) = (uVar3 + 1) * 0x100 | (ushort)(uVar3 + 1) >> 8;
      lStack_50 = 0xb;
    }
    memcpy(pcVar6 + lStack_50,local_38,(long)(iVar7 + 1));
    free(local_38);
  }
  *length = (iVar7 + 1 + (int)lStack_50 + (int)pcVar6) - (int)__dest;
  return __dest;
}

Assistant:

char *serilizeRr(DNSRr *dnsRr, int *length)
{

    char *formatedName = toInternetFormat(dnsRr->name);
    int dataLength = 0;
    char *formatedData;
    if (dnsRr->type == T_A)
    {
        dataLength = 4;
    } else
    {
        formatedData = toInternetFormat(dnsRr->data);
        dataLength = strlen(formatedData);
    }
    char *result = (char *) malloc(strlen(formatedName) + dataLength + 4 + 4 + 2 + 2 + 2);
    checkMalloc(result);

    char *ptr = result;
    strcpy(ptr, formatedName);

    ptr += strlen(formatedName) + 1;
    free(formatedName);
    *(unsigned short *) ptr = htons(dnsRr->type);
    ptr += 2;
    *(unsigned short *) ptr = htons(dnsRr->class);
    ptr += 2;
    *(unsigned int *) ptr = htonl(dnsRr->ttl);

    ptr += 4;


    if (dnsRr->type == T_MX)
    {
        *(unsigned short *) ptr = htons(dataLength + 3);
        ptr += 2;
        *(unsigned short *) ptr = htons(0x05);
        ptr += 2;
    } else if (dnsRr->type == T_A)
    {
        *(unsigned short *) ptr = htons(dataLength);
        ptr += 2;
    } else
    {
        *(unsigned short *) ptr = htons(dataLength + 1);
        ptr += 2;
    }

    if (dnsRr->type == T_A)
    {
        *(unsigned int *) ptr = inet_addr(dnsRr->data);

    } else
    {
        memcpy(ptr, formatedData, dataLength + 1);
        free(formatedData);
    }
    ptr += dataLength + 1;

    *length = ptr - result;
    return result;
}